

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

LargeHeapBlock *
Memory::LargeHeapBlock::New
          (char *address,size_t pageCount,Segment *segment,uint objectCount,LargeHeapBucket *bucket)

{
  HeapAllocator *pHVar1;
  size_t sVar2;
  LargeHeapBlock *this;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  data._32_8_ = bucket;
  pHVar1 = HeapAllocator::GetNoMemProtectInstance();
  data.typeinfo = (type_info *)GetAllocPlusSize(objectCount);
  local_60 = (undefined1  [8])&typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_f3aa8;
  data.filename._0_4_ = 0xa6;
  pHVar1 = HeapAllocator::TrackAllocInfo(pHVar1,(TrackAllocData *)local_60);
  sVar2 = GetAllocPlusSize(objectCount);
  this = (LargeHeapBlock *)HeapAllocator::NoThrowAllocZero(pHVar1,sVar2 + 0xb8);
  LargeHeapBlock(this,address,pageCount,segment,objectCount,(LargeHeapBucket *)data._32_8_);
  return this;
}

Assistant:

LargeHeapBlock *
LargeHeapBlock::New(__in char * address, DECLSPEC_GUARD_OVERFLOW size_t pageCount, Segment * segment, DECLSPEC_GUARD_OVERFLOW uint objectCount, LargeHeapBucket* bucket)
{
    return NoMemProtectHeapNewNoThrowPlusZ(GetAllocPlusSize(objectCount), LargeHeapBlock, address, pageCount, segment, objectCount, bucket);
}